

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_int_array(jsmntok_t *tokens,int i,uint8_t *json_chunk,int *out_array,int size)

{
  int iVar1;
  int local_38;
  int j;
  int size_local;
  int *out_array_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  
  if (tokens[i].type == JSMN_ARRAY) {
    if (tokens[i].size == size) {
      json_chunk_local._4_4_ = i + 1;
      for (local_38 = 0; local_38 < size; local_38 = local_38 + 1) {
        if (tokens[json_chunk_local._4_4_].type != JSMN_PRIMITIVE) {
          return -1;
        }
        iVar1 = cgltf_json_to_int(tokens + json_chunk_local._4_4_,json_chunk);
        out_array[local_38] = iVar1;
        json_chunk_local._4_4_ = json_chunk_local._4_4_ + 1;
      }
      tokens_local._4_4_ = json_chunk_local._4_4_;
    }
    else {
      tokens_local._4_4_ = -1;
    }
  }
  else {
    tokens_local._4_4_ = -1;
  }
  return tokens_local._4_4_;
}

Assistant:

static int cgltf_parse_json_int_array(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, int* out_array, int size)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_ARRAY);
	if (tokens[i].size != size)
	{
		return CGLTF_ERROR_JSON;
	}
	++i;
	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_PRIMITIVE);
		out_array[j] = cgltf_json_to_int(tokens + i, json_chunk);
		++i;
	}
	return i;
}